

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::SpecparamDeclarationSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,SpecparamDeclarationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  ImplicitTypeSyntax *node;
  SyntaxNode *local_70;
  SyntaxNode *local_60;
  size_t index_local;
  SpecparamDeclarationSyntax *this_local;
  
  switch(index) {
  case 0:
    local_60 = (SyntaxNode *)0x0;
    if (this != (SpecparamDeclarationSyntax *)0xfffffffffffffff0) {
      local_60 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_60);
    break;
  case 1:
    token.kind = (this->keyword).kind;
    token._2_1_ = (this->keyword).field_0x2;
    token.numFlags.raw = (this->keyword).numFlags.raw;
    token.rawLen = (this->keyword).rawLen;
    token.info = (this->keyword).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    node = not_null<slang::syntax::ImplicitTypeSyntax_*>::get(&this->type);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)node);
    break;
  case 3:
    local_70 = (SyntaxNode *)0x0;
    if (this != (SpecparamDeclarationSyntax *)0xffffffffffffffa8) {
      local_70 = &(this->declarators).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 4:
    token_00.kind = (this->semi).kind;
    token_00._2_1_ = (this->semi).field_0x2;
    token_00.numFlags.raw = (this->semi).numFlags.raw;
    token_00.rawLen = (this->semi).rawLen;
    token_00.info = (this->semi).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax SpecparamDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return type.get();
        case 3: return &declarators;
        case 4: return semi;
        default: return nullptr;
    }
}